

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessageDelimiter
          (ParserImpl *this,string *delimiter)

{
  bool bVar1;
  byte bVar2;
  string *in_RSI;
  string *unaff_retaddr;
  ParserImpl *in_stack_00000008;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  ParserImpl *in_stack_ffffffffffffff68;
  allocator *paVar3;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"<",&local_39);
  bVar1 = TryConsume(in_stack_ffffffffffffff68,
                     (string *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    std::__cxx11::string::operator=(local_18,">");
  }
  else {
    paVar3 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"{",paVar3);
    bVar2 = Consume(in_stack_00000008,unaff_retaddr);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if ((bVar2 & 1) == 0) {
      return false;
    }
    std::__cxx11::string::operator=(local_18,"}");
  }
  return true;
}

Assistant:

bool ConsumeMessageDelimiter(std::string* delimiter) {
    if (TryConsume("<")) {
      *delimiter = ">";
    } else {
      DO(Consume("{"));
      *delimiter = "}";
    }
    return true;
  }